

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O2

_Bool ttf_get_glyph_worker
                (ALLEGRO_FONT *f,int prev_ft_index,int ft_index,int prev_codepoint,int codepoint,
                ALLEGRO_GLYPH *info)

{
  REGION RVar1;
  ALLEGRO_TTF_FONT_DATA *data;
  FT_Face_conflict face;
  ALLEGRO_FONT *pAVar2;
  undefined1 auVar3 [12];
  _Bool _Var4;
  char cVar5;
  int iVar6;
  undefined1 auVar7 [16];
  ALLEGRO_TTF_GLYPH_DATA *glyph;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  data = (ALLEGRO_TTF_FONT_DATA *)f->data;
  face = data->face;
  _Var4 = get_glyph(data,ft_index,&glyph);
  if (!_Var4) {
    pAVar2 = f->fallback;
    if (pAVar2 != (ALLEGRO_FONT *)0x0) {
      _Var4 = (*pAVar2->vtable->get_glyph)(pAVar2,prev_codepoint,codepoint,info);
      return _Var4;
    }
    ft_index = 0;
    get_glyph(data,0,&glyph);
  }
  cache_glyph(data,face,ft_index,glyph,false);
  iVar6 = get_kerning(data,face,prev_ft_index,ft_index);
  if (glyph->page_bitmap == (ALLEGRO_BITMAP *)0x0) {
    if (0 < (glyph->region).x) {
      cVar5 = _al_trace_prefix("font",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                               ,0x219,"ttf_get_glyph_worker");
      if (cVar5 != '\0') {
        _al_trace_suffix("Glyph %d not on any page.\n",ft_index);
        return false;
      }
      return false;
    }
    info->bitmap = (ALLEGRO_BITMAP *)0x0;
  }
  else {
    info->bitmap = glyph->page_bitmap;
    RVar1 = glyph->region;
    auVar9._8_4_ = 0;
    auVar9._0_2_ = RVar1.x;
    auVar9._2_2_ = RVar1.y;
    auVar9._4_2_ = RVar1.w;
    auVar9._6_2_ = RVar1.h;
    auVar9._12_2_ = RVar1.h;
    auVar9._14_2_ = RVar1.h;
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._8_2_ = 0;
    auVar8._0_2_ = RVar1.x;
    auVar8._2_2_ = RVar1.y;
    auVar8._4_2_ = RVar1.w;
    auVar8._6_2_ = RVar1.h;
    auVar8._10_2_ = RVar1.w;
    auVar7._10_6_ = auVar8._10_6_;
    auVar7._8_2_ = RVar1.w;
    auVar7._0_2_ = RVar1.x;
    auVar7._2_2_ = RVar1.y;
    auVar7._4_2_ = RVar1.w;
    auVar7._6_2_ = RVar1.h;
    auVar3._4_8_ = auVar7._8_8_;
    auVar3._2_2_ = RVar1.y;
    auVar3._0_2_ = RVar1.y;
    info->x = RVar1.x + 1;
    info->y = (auVar3._0_4_ >> 0x10) + 1;
    info->w = (auVar7._8_4_ >> 0x10) + -2;
    info->h = (auVar8._12_4_ >> 0x10) + -2;
    info->kerning = iVar6;
    info->offset_x = (int)glyph->offset_x;
    info->offset_y = (int)glyph->offset_y;
  }
  info->advance = iVar6 + glyph->advance;
  return true;
}

Assistant:

static bool ttf_get_glyph_worker(ALLEGRO_FONT const *f, int prev_ft_index, int ft_index, int prev_codepoint, int codepoint, ALLEGRO_GLYPH *info)
{
   ALLEGRO_TTF_FONT_DATA *data = f->data;
   FT_Face face = data->face;
   ALLEGRO_TTF_GLYPH_DATA *glyph;
   int advance = 0;

   if (!get_glyph(data, ft_index, &glyph)) {
      if (f->fallback)
         return f->fallback->vtable->get_glyph(f->fallback, prev_codepoint, codepoint, info);
      else {
         get_glyph(data, 0, &glyph);
         ft_index = 0;
      }
   }

   cache_glyph(data, face, ft_index, glyph, false);

   advance += get_kerning(data, face, prev_ft_index, ft_index);

   if (glyph->page_bitmap) {
      info->bitmap = glyph->page_bitmap;
      info->x = glyph->region.x + 1;
      info->y = glyph->region.y + 1;
      info->w = glyph->region.w - 2;
      info->h = glyph->region.h - 2;
      info->kerning = advance;
      info->offset_x = glyph->offset_x;
      info->offset_y = glyph->offset_y;
   }
   else if (glyph->region.x > 0) {
      ALLEGRO_ERROR("Glyph %d not on any page.\n", ft_index);
      return false;
   }
   else {
      info->bitmap = 0;
   }

   advance += glyph->advance;

   info->advance = advance;

   return true;
}